

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

TrimPositions QStringAlgorithms<const_QString>::trimmed_helper_positions(QString *str)

{
  Char *pCVar1;
  bool bVar2;
  Char *pCVar3;
  Char *pCVar4;
  TrimPositions TVar5;
  
  pCVar3 = (Char *)(str->d).ptr;
  pCVar1 = pCVar3 + (str->d).size;
  do {
    pCVar4 = pCVar1;
    if (pCVar4 <= pCVar3) break;
    bVar2 = isSpace((QChar)pCVar4[-1].ucs);
    pCVar1 = pCVar4 + -1;
  } while (bVar2);
  while ((pCVar3 < pCVar4 && (bVar2 = isSpace((QChar)pCVar3->ucs), bVar2))) {
    pCVar3 = pCVar3 + 1;
  }
  TVar5.end = pCVar4;
  TVar5.begin = pCVar3;
  return TVar5;
}

Assistant:

const T *data() const noexcept { return ptr; }